

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_avx2.c
# Opt level: O0

void VP8LEncDspInitAVX2(void)

{
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void VP8LEncDspInitAVX2(void) {
  VP8LSubtractGreenFromBlueAndRed = SubtractGreenFromBlueAndRed_AVX2;
  VP8LTransformColor = TransformColor_AVX2;
  VP8LCollectColorBlueTransforms = CollectColorBlueTransforms_AVX2;
  VP8LCollectColorRedTransforms = CollectColorRedTransforms_AVX2;
  VP8LAddVector = AddVector_AVX2;
  VP8LAddVectorEq = AddVectorEq_AVX2;
  VP8LCombinedShannonEntropy = CombinedShannonEntropy_AVX2;
  VP8LVectorMismatch = VectorMismatch_AVX2;
  VP8LBundleColorMap = BundleColorMap_AVX2;

  VP8LPredictorsSub[0] = PredictorSub0_AVX2;
  VP8LPredictorsSub[1] = PredictorSub1_AVX2;
  VP8LPredictorsSub[2] = PredictorSub2_AVX2;
  VP8LPredictorsSub[3] = PredictorSub3_AVX2;
  VP8LPredictorsSub[4] = PredictorSub4_AVX2;
  VP8LPredictorsSub[5] = PredictorSub5_AVX2;
  VP8LPredictorsSub[6] = PredictorSub6_AVX2;
  VP8LPredictorsSub[7] = PredictorSub7_AVX2;
  VP8LPredictorsSub[8] = PredictorSub8_AVX2;
  VP8LPredictorsSub[9] = PredictorSub9_AVX2;
  VP8LPredictorsSub[10] = PredictorSub10_AVX2;
  VP8LPredictorsSub[11] = PredictorSub11_AVX2;
  VP8LPredictorsSub[12] = PredictorSub12_AVX2;
  VP8LPredictorsSub[13] = PredictorSub13_AVX2;
  VP8LPredictorsSub[14] = PredictorSub0_AVX2;  // <- padding security sentinels
  VP8LPredictorsSub[15] = PredictorSub0_AVX2;
}